

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void hessenberg(double *A,int N)

{
  ulong uVar1;
  size_t __size;
  int m;
  int i;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  int N_00;
  ulong uVar8;
  ulong uVar9;
  int n;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double *local_90;
  long local_80;
  int N_1;
  ulong local_60;
  double *local_58;
  int N_2;
  
  lVar13 = (long)N;
  __size = lVar13 * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  A_00 = (double *)malloc(__size * lVar13);
  C = (double *)malloc(__size);
  if (2 < N) {
    uVar14 = (ulong)(uint)N;
    pdVar5 = A + lVar13;
    local_90 = A + uVar14;
    lVar11 = lVar13 << 0x20;
    local_60 = 1;
    lVar4 = lVar13;
    uVar7 = 0;
    uVar12 = uVar14;
    uVar8 = uVar14;
    local_58 = A;
    local_80 = lVar11;
    do {
      local_80 = local_80 + -0x100000000;
      uVar8 = uVar8 - 1;
      uVar1 = uVar7 + 1;
      if ((long)uVar1 < lVar13) {
        uVar3 = 0;
        pdVar2 = pdVar5;
        do {
          x[uVar3] = *pdVar2;
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + lVar13;
        } while (uVar8 != uVar3);
      }
      m = (int)(lVar13 - uVar7);
      N_00 = m + -1;
      dVar15 = house(x,N_00,v);
      if ((long)uVar1 < lVar13) {
        lVar6 = 0;
        pdVar2 = local_90;
        uVar3 = local_60;
        do {
          uVar9 = 0;
          lVar10 = lVar6;
          do {
            *(double *)((long)A_00 + (lVar10 >> 0x1d)) = pdVar2[uVar9];
            lVar10 = lVar10 + (uVar8 << 0x20);
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
          uVar3 = uVar3 + 1;
          lVar6 = lVar6 + 0x100000000;
          pdVar2 = pdVar2 + uVar14;
        } while (uVar3 != uVar14);
      }
      n = ~(uint)uVar7 + N;
      mmult(A_00,v,C,m,n,1);
      if (0 < (long)(lVar13 - uVar7)) {
        lVar6 = 0;
        do {
          C[lVar6] = C[lVar6] * dVar15;
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
      }
      mmult(v,C,A_00,n,1,m);
      if ((long)uVar1 < lVar13) {
        lVar6 = 0;
        pdVar2 = pdVar5;
        uVar7 = local_60;
        do {
          uVar3 = 0;
          lVar10 = lVar6;
          do {
            pdVar2[uVar3] = pdVar2[uVar3] - *(double *)((long)A_00 + (lVar10 >> 0x1d));
            uVar3 = uVar3 + 1;
            lVar10 = lVar10 + 0x100000000;
          } while (uVar12 != uVar3);
          uVar7 = uVar7 + 1;
          pdVar2 = pdVar2 + lVar13;
          lVar6 = lVar6 + lVar11;
        } while (uVar7 != uVar14);
      }
      lVar6 = 0;
      uVar7 = 0;
      pdVar2 = local_58;
      do {
        if ((long)uVar1 < lVar13) {
          uVar3 = 1;
          lVar10 = lVar6;
          do {
            *(double *)((long)A_00 + (lVar10 >> 0x1d)) = pdVar2[uVar3];
            uVar3 = uVar3 + 1;
            lVar10 = lVar10 + 0x100000000;
          } while (uVar12 != uVar3);
        }
        uVar7 = uVar7 + 1;
        pdVar2 = pdVar2 + lVar13;
        lVar6 = lVar6 + local_80;
      } while (uVar7 != uVar14);
      mmult(A_00,v,C,N,N_00,1);
      uVar7 = 0;
      do {
        C[uVar7] = C[uVar7] * dVar15;
        uVar7 = uVar7 + 1;
      } while (uVar14 != uVar7);
      mmult(C,v,A_00,N,1,N_00);
      lVar6 = 0;
      uVar7 = 0;
      pdVar2 = local_58;
      do {
        if ((long)uVar1 < lVar13) {
          uVar3 = 1;
          lVar10 = lVar6;
          do {
            pdVar2[uVar3] = pdVar2[uVar3] - *(double *)((long)A_00 + (lVar10 >> 0x1d));
            uVar3 = uVar3 + 1;
            lVar10 = lVar10 + 0x100000000;
          } while (uVar12 != uVar3);
        }
        uVar7 = uVar7 + 1;
        pdVar2 = pdVar2 + lVar13;
        lVar6 = lVar6 + local_80;
      } while (uVar7 != uVar14);
      local_60 = local_60 + 1;
      pdVar5 = pdVar5 + lVar13 + 1;
      local_90 = local_90 + uVar14 + 1;
      uVar12 = uVar12 - 1;
      lVar4 = lVar4 + -1;
      lVar11 = lVar11 + -0x100000000;
      local_58 = local_58 + 1;
      uVar7 = uVar1;
    } while (uVar1 != N - 2);
  }
  free(x);
  free(v);
  free(A_00);
  free(C);
  return;
}

Assistant:

void hessenberg(double *A,int N) {
	int k,i,j,t,u;
	double *x,*v,*AT,*w;
	double beta;
	x = (double*) malloc(sizeof(double) * N);
	v = (double*) malloc(sizeof(double) * N);
	AT = (double*) malloc(sizeof(double) * N * N);
	w = (double*) malloc(sizeof(double) * N);
	
	for (k = 0; k < N-2;++k) {
		for(i=k + 1;i < N;++i) {
			x[i-k-1] = A[i*N+k];
			//printf("x %lf \n",x[i-k-1]);
			
		}
		
		beta = house(x,N-k-1,v);
		
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			u = 0;
			for (j=k; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=(N-k-1);				
			}
		}
		//mdisplay(AT,N-k,N-k-1);
		
		
		mmult(AT,v,w,N-k,N-k-1,1);
		scale(w,N-k,1,beta);
		mmult(v,w,AT,N-k-1,1,N-k);
		//mdisplay(AT,N-k-1,N-k);
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			for (j=k; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-k) + j - k];
			}
		}
		//mdisplay(A,N,N);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		//mdisplay(AT,N,N-k-1);
		
		mmult(AT,v,w,N,N-k-1,1);
		scale(w,N,1,beta);
		mmult(w,v,AT,N,1,N-k-1);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}